

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi.c
# Opt level: O0

MPI_Request getMPIRequest(IceTCommRequest icet_request)

{
  IceTCommRequest icet_request_local;
  
  if (icet_request == (IceTCommRequest)0x0) {
    icet_request_local = (IceTCommRequest)&ompi_request_null;
  }
  else if (icet_request->magic_number == 0xd7168b00) {
    icet_request_local = *icet_request->internals;
  }
  else {
    icetRaiseDiagnostic("Request object is not from the MPI communicator.",0xfffffffa,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/communication/mpi.c"
                        ,99);
    icet_request_local = (IceTCommRequest)&ompi_request_null;
  }
  return (MPI_Request)icet_request_local;
}

Assistant:

static MPI_Request getMPIRequest(IceTCommRequest icet_request)
{
    if (icet_request == ICET_COMM_REQUEST_NULL) {
        return MPI_REQUEST_NULL;
    }

    if (icet_request->magic_number != ICET_MPI_REQUEST_MAGIC_NUMBER) {
        icetRaiseError("Request object is not from the MPI communicator.",
                       ICET_INVALID_VALUE);
        return MPI_REQUEST_NULL;
    }

    return (((IceTMPICommRequestInternals)icet_request->internals)->request);
}